

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX.H
# Opt level: O1

void amrex::FArrayBox::setPrecision(Precision param_1)

{
  char *in_stack_00000010;
  
  Warning_host(in_stack_00000010);
  return;
}

Assistant:

AMREX_GPU_HOST_DEVICE AMREX_FORCE_INLINE
    void Warning (const char * msg) {
#if AMREX_DEVICE_COMPILE
#if defined(NDEBUG)
        amrex::ignore_unused(msg);
#else
        if (msg) AMREX_DEVICE_PRINTF("Warning %s\n", msg);
#endif
#else
        Warning_host(msg);
#endif
    }